

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDefinition
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  Type TVar2;
  CppType CVar3;
  Descriptor *pDVar4;
  string *__rhs;
  mapped_type *pmVar5;
  FieldOptions *this_00;
  char *pcVar6;
  undefined1 in_CL;
  int i;
  FieldDescriptor *descriptor;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  allocator<char> local_361;
  key_type local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  allocator<char> local_319;
  key_type local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  undefined1 local_2a8 [8];
  string global_name;
  key_type local_280;
  allocator<char> local_259;
  key_type local_258;
  allocator<char> local_231;
  key_type local_230;
  string local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  key_type local_1a0;
  string local_180;
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  string local_e8;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string name;
  string local_70;
  byte local_3a;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string scope;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  scope.field_2._8_8_ = printer;
  pDVar4 = FieldDescriptor::extension_scope(this->descriptor_);
  local_3a = 0;
  if (pDVar4 == (Descriptor *)0x0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
  }
  else {
    pDVar4 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassName_abi_cxx11_(&local_70,(cpp *)pDVar4,(Descriptor *)0x0,(bool)in_CL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   &local_70,"::");
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_39);
  }
  __rhs = FieldDescriptor::name_abi_cxx11_(this->descriptor_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__rhs
                );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_c8);
  (anonymous_namespace)::ExtendeeClassName_abi_cxx11_
            (&local_e8,(_anonymous_namespace_ *)this->descriptor_,descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"extendee",&local_109);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_108);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"type_traits",&local_131);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_130);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&this->type_traits_);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"name",&local_159);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_158);
  std::__cxx11::string::operator=
            ((string *)pmVar5,(string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  FieldConstantName_abi_cxx11_(&local_180,(cpp *)this->descriptor_,field);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"constant_name",&local_1a1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_1a0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_180);
  DefaultValue_abi_cxx11_(&local_1c8,(cpp *)this->descriptor_,field_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"default",&local_1e9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_1e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c8);
  TVar2 = FieldDescriptor::type(this->descriptor_);
  SimpleItoa_abi_cxx11_(&local_210,(protobuf *)(ulong)TVar2,i);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"field_type",&local_231);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_230);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string((string *)&local_210);
  this_00 = FieldDescriptor::options(this->descriptor_);
  bVar1 = FieldOptions::packed(this_00);
  pcVar6 = "false";
  if (bVar1) {
    pcVar6 = "true";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"packed",&local_259);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_258);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"scope",
             (allocator<char> *)(global_name.field_2._M_local_buf + 0xf));
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_c8,&local_280);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)(global_name.field_2._M_local_buf + 0xf));
  CVar3 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar3 == CPPTYPE_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"::",&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"_",&local_2f1);
    StringReplace((string *)local_2a8,
                  (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2c8,
                  &local_2f0,true);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"global_name",&local_319);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c8,&local_318);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)local_2a8);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    io::Printer::Print((Printer *)scope.field_2._8_8_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_c8,"const ::std::string $global_name$_default($default$);\n");
    std::operator+(&local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                   "_default");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"default",&local_361);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c8,&local_360);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)local_2a8);
  }
  pDVar4 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar4 != (Descriptor *)0x0) {
    io::Printer::Print((Printer *)scope.field_2._8_8_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_c8,"#ifndef _MSC_VER\nconst int $scope$$constant_name$;\n#endif\n");
  }
  io::Printer::Print((Printer *)scope.field_2._8_8_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c8,
                     "::google::protobuf::internal::ExtensionIdentifier< $extendee$,\n    ::google::protobuf::internal::$type_traits$, $field_type$, $packed$ >\n  $name$($constant_name$, $default$);\n"
                    );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_c8);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ExtensionGenerator::GenerateDefinition(io::Printer* printer) {
  // If this is a class member, it needs to be declared in its class scope.
  string scope = (descriptor_->extension_scope() == NULL) ? "" :
    ClassName(descriptor_->extension_scope(), false) + "::";
  string name = scope + descriptor_->name();

  map<string, string> vars;
  vars["extendee"     ] = ExtendeeClassName(descriptor_);
  vars["type_traits"  ] = type_traits_;
  vars["name"         ] = name;
  vars["constant_name"] = FieldConstantName(descriptor_);
  vars["default"      ] = DefaultValue(descriptor_);
  vars["field_type"   ] = SimpleItoa(static_cast<int>(descriptor_->type()));
  vars["packed"       ] = descriptor_->options().packed() ? "true" : "false";
  vars["scope"        ] = scope;

  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    // We need to declare a global string which will contain the default value.
    // We cannot declare it at class scope because that would require exposing
    // it in the header which would be annoying for other reasons.  So we
    // replace :: with _ in the name and declare it as a global.
    string global_name = StringReplace(name, "::", "_", true);
    vars["global_name"] = global_name;
    printer->Print(vars,
      "const ::std::string $global_name$_default($default$);\n");

    // Update the default to refer to the string global.
    vars["default"] = global_name + "_default";
  }

  // Likewise, class members need to declare the field constant variable.
  if (descriptor_->extension_scope() != NULL) {
    printer->Print(vars,
      "#ifndef _MSC_VER\n"
      "const int $scope$$constant_name$;\n"
      "#endif\n");
  }

  printer->Print(vars,
    "::google::protobuf::internal::ExtensionIdentifier< $extendee$,\n"
    "    ::google::protobuf::internal::$type_traits$, $field_type$, $packed$ >\n"
    "  $name$($constant_name$, $default$);\n");
}